

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_giant_strength(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (!bVar1) {
    init_affect(&local_90);
    local_90.where = 0;
    local_90.aftype = get_spell_aftype(ch);
    local_90.type = (short)sn;
    local_90.location = 1;
    local_90.modifier = (ushort)(0x1f < level) + (ushort)(0x18 < level) + (ushort)(0x11 < level) + 1
    ;
    local_90.level = (short)level;
    local_90.duration = (short)level;
    affect_to_char((CHAR_DATA *)vo,&local_90);
    send_to_char("Your muscles surge with heightened power!\n\r",(CHAR_DATA *)vo);
    act("$n\'s muscles surge with heightened power.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    return;
  }
  if ((CHAR_DATA *)vo != ch) {
    act("$N can\'t get any stronger.",ch,(void *)0x0,vo,3);
    return;
  }
  send_to_char("You are already as strong as you can get!\n\r",ch);
  return;
}

Assistant:

void spell_giant_strength(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already as strong as you can get!\n\r", ch);
		else
			act("$N can't get any stronger.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level;
	af.location = APPLY_STR;
	af.modifier = 1 + (level >= 18) + (level >= 25) + (level >= 32);
	affect_to_char(victim, &af);

	send_to_char("Your muscles surge with heightened power!\n\r", victim);
	act("$n's muscles surge with heightened power.", victim, nullptr, nullptr, TO_ROOM);
}